

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

ACT_TYPE __thiscall
despot::TagHistoryModePolicy::Action
          (TagHistoryModePolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  value_type_conflict1 vVar1;
  History *pHVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ACT_TYPE AVar6;
  reference pvVar7;
  long *plVar8;
  size_t sVar9;
  mapped_type *pmVar10;
  size_type sVar11;
  const_reference pvVar12;
  OBS_TYPE OVar13;
  undefined8 uVar14;
  reference pvVar15;
  int act;
  value_type_conflict1 local_100;
  undefined8 uStack_fc;
  int d_1;
  value_type_conflict1 local_f4;
  undefined8 uStack_f0;
  int d;
  undefined8 local_e8;
  undefined8 local_e0;
  Coord rob;
  vector<int,_std::allocator<int>_> actions;
  vector<int,_std::allocator<int>_> *policy;
  OBS_TYPE obs;
  undefined1 local_a8 [4];
  ACT_TYPE action;
  int local_90;
  int opp;
  int local_7c;
  undefined1 local_78 [4];
  int rob_1;
  State mode;
  int local_6c;
  Belief *belief;
  _Self local_48;
  int **local_40;
  OBS_TYPE obs_1;
  History *pHStack_30;
  ACT_TYPE action_1;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  TagHistoryModePolicy *this_local;
  
  pHStack_30 = history;
  history_local = (History *)streams;
  streams_local = (RandomStreams *)particles;
  particles_local = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)this;
  iVar5 = despot::RandomStreams::position();
  if (iVar5 == 0) {
    this_local._4_4_ = this->first_action_;
  }
  else {
    iVar5 = despot::RandomStreams::position();
    if (iVar5 == 1) {
      obs_1._4_4_ = History::LastAction(pHStack_30);
      local_40 = (int **)History::LastObservation(pHStack_30);
      pvVar7 = std::
               vector<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
               ::operator[](&this->paths_,(long)obs_1._4_4_);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::find(pvVar7,(key_type_conflict *)&local_40);
      pvVar7 = std::
               vector<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
               ::operator[](&this->paths_,(long)obs_1._4_4_);
      belief = (Belief *)
               std::
               map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::end(pvVar7);
      bVar3 = std::operator==(&local_48,(_Self *)&belief);
      if (bVar3) {
        plVar8 = (long *)(**(code **)(*(long *)this->tag_model_ + 0x108))
                                   (this->tag_model_,this->belief_,obs_1._4_4_,local_40);
        ComputeMode((TagHistoryModePolicy *)local_78,(Belief *)this);
        local_7c = BaseTag::StateIndexToRobIndex(this->tag_model_,local_6c);
        local_90 = BaseTag::StateIndexToOppIndex(this->tag_model_,local_6c);
        despot::Floor::ComputeShortestPath((int)local_a8,(int)this + 0x30);
        pvVar7 = std::
                 vector<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                 ::operator[](&this->paths_,(long)obs_1._4_4_);
        pmVar10 = std::
                  map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](pvVar7,(key_type_conflict *)&local_40);
        std::vector<int,_std::allocator<int>_>::operator=
                  (pmVar10,(vector<int,_std::allocator<int>_> *)local_a8);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_a8);
        if (plVar8 != (long *)0x0) {
          (**(code **)(*plVar8 + 8))();
        }
        despot::State::~State((State *)local_78);
      }
    }
    pHVar2 = pHStack_30;
    sVar9 = History::Size(pHStack_30);
    iVar5 = despot::RandomStreams::position();
    obs._4_4_ = History::Action(pHVar2,(int)sVar9 - iVar5);
    pHVar2 = pHStack_30;
    sVar9 = History::Size(pHStack_30);
    iVar5 = despot::RandomStreams::position();
    policy = (vector<int,_std::allocator<int>_> *)History::Observation(pHVar2,(int)sVar9 - iVar5);
    pvVar7 = std::
             vector<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
             ::operator[](&this->paths_,(long)obs._4_4_);
    pmVar10 = std::
              map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](pvVar7,(key_type_conflict *)&policy);
    iVar5 = despot::RandomStreams::position();
    sVar11 = std::vector<int,_std::allocator<int>_>::size(pmVar10);
    if ((ulong)(long)(iVar5 + -1) < sVar11) {
      iVar5 = despot::RandomStreams::position();
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,(long)(iVar5 + -1));
      this_local._4_4_ = *pvVar12;
    }
    else {
      OVar13 = History::LastObservation(pHStack_30);
      if (OVar13 == this->tag_model_->same_loc_obs_) {
        this_local._4_4_ = BaseTag::TagAction(this->tag_model_);
      }
      else {
        std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&rob);
        despot::Coord::Coord((Coord *)&local_e0);
        OVar13 = this->tag_model_->same_loc_obs_;
        iVar5 = despot::Floor::NumCells();
        if (OVar13 == (long)iVar5) {
          History::LastObservation(pHStack_30);
          uStack_f0 = despot::Floor::GetCell((int)this + 0x30);
          local_e0 = uStack_f0;
        }
        else {
          local_e8 = BaseTag::MostLikelyRobPosition
                               (this->tag_model_,
                                (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                                streams_local);
          local_e0 = local_e8;
        }
        for (local_f4 = 0; vVar1 = local_f4, local_f4 < 4; local_f4 = local_f4 + 1) {
          AVar6 = History::LastAction(pHStack_30);
          bVar4 = despot::Compass::Opposite(vVar1,AVar6);
          if ((bVar4 & 1) == 0) {
            uStack_fc = despot::operator+((Coord *)&local_e0,
                                          (Coord *)(&Compass::DIRECTIONS + local_f4));
            bVar4 = despot::Floor::Inside(&this->floor_,uStack_fc);
            if ((bVar4 & 1) != 0) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&rob,&local_f4);
            }
          }
        }
        sVar11 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)&rob);
        if (sVar11 == 0) {
          for (local_100 = 0; local_100 < 4; local_100 = local_100 + 1) {
            uVar14 = despot::operator+((Coord *)&local_e0,
                                       (Coord *)(&Compass::DIRECTIONS + local_100));
            bVar4 = despot::Floor::Inside(&this->floor_,uVar14);
            if ((bVar4 & 1) != 0) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&rob,&local_100);
            }
          }
        }
        sVar11 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)&rob);
        if (sVar11 == 0) {
          this_local._4_4_ = 0;
        }
        else {
          std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&rob);
          iVar5 = despot::Random::NextInt(0x15b198);
          pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&rob,(long)iVar5);
          this_local._4_4_ = *pvVar15;
        }
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&rob);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles,
		RandomStreams& streams, History& history) const {
		if (streams.position() == 0)
		return first_action_;

		if (streams.position() == 1) {
			ACT_TYPE action = history.LastAction();
			OBS_TYPE obs = history.LastObservation();

			if (paths_[action].find(obs) == paths_[action].end()) {
				Belief* belief = tag_model_->Tau(belief_, action, obs);

				State mode = ComputeMode(belief);
				int rob = tag_model_->StateIndexToRobIndex(mode.state_id);
				int opp = tag_model_->StateIndexToOppIndex(mode.state_id);
				paths_[action][obs] = floor_.ComputeShortestPath(rob, opp);

				delete belief;
			}
		}

		ACT_TYPE action = history.Action(history.Size() - streams.position());
		OBS_TYPE obs = history.Observation(history.Size() - streams.position());
		const vector<int>& policy = paths_[action][obs];

		if (streams.position() - 1 < policy.size()) {
			return policy[streams.position() - 1];
		}

		if (history.LastObservation() == tag_model_->same_loc_obs_)
		return tag_model_->TagAction();

		vector<int> actions;
		// Compute rob position
		Coord rob;
		if (tag_model_->same_loc_obs_ != floor_.NumCells()) {
			rob = tag_model_->MostLikelyRobPosition(particles);
		} else {
			rob = floor_.GetCell(history.LastObservation());
		}

		// Don't double back and don't go into walls
		for (int d = 0; d < 4; d ++) {
			if (!Compass::Opposite(d, history.LastAction()) && floor_.Inside(rob + Compass::DIRECTIONS[d])) {
				actions.push_back(d);
			}
		}

		if (actions.size() == 0) {
			for (int d = 0; d < 4; d ++) {
				if (floor_.Inside(rob + Compass::DIRECTIONS[d]))
				actions.push_back(d);
			}
		}

		if (actions.size() == 0) // Rob may be trapped by the obstacles
		return 0;

		int act = actions[Random::RANDOM.NextInt(actions.size())];
		return act;
	}